

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patomic-sync.c
# Opt level: O1

void p_atomic_pointer_set(void *atomic,ppointer val)

{
  *(ppointer *)atomic = val;
  return;
}

Assistant:

P_LIB_API void
p_atomic_pointer_set (volatile void	*atomic,
		      ppointer		val)
{
	volatile psize *cur_val = (volatile psize *) atomic;

	*cur_val = (psize) val;
#ifdef P_CC_CRAY
	__builtin_ia32_mfence ();
#else
	__sync_synchronize ();
#endif
}